

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg.cpp
# Opt level: O2

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)

{
  MppCodingType MVar1;
  MppFrameFormat MVar2;
  RK_S32 bpp;
  RockchipSocType RVar3;
  SysCfgAlignType SVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  SysCfgAlignType type;
  uint uVar9;
  uint uVar10;
  RK_U32 RVar11;
  int iVar12;
  RK_U32 RVar13;
  MppFrameFormat MVar14;
  bool bVar15;
  
  MVar1 = cfg->type;
  MVar2 = cfg->fmt_codec;
  MVar14 = MVar2 & 0xfffff;
  if ((MVar14 | MPP_FMT_YUV422SP) == MPP_FMT_YUV422SP_10BIT) {
    iVar12 = 10;
  }
  else {
    iVar12 = (uint)(MVar14 == MPP_FMT_YUV444SP_10BIT) * 2 + 8;
  }
  if (MVar1 == MPP_VIDEO_CodingUnused) {
    _mpp_log_l(2,"mpp_sys_cfg","The coding type is invalid",(char *)0x0);
    return MPP_NOK;
  }
  uVar10 = cfg->fmt_fbc;
  RVar11 = cfg->v_stride;
  if ((((byte)mpp_sys_cfg_debug & 0x10) != 0) &&
     (_mpp_log_l(4,"mpp_sys_cfg","org pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)cfg->width,(ulong)cfg->height), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) {
    _mpp_log_l(4,"mpp_sys_cfg","outside stride wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)cfg->h_stride_by_byte,(ulong)cfg->v_stride);
  }
  if ((uVar10 & 0xf00000) != 0) {
    if ((MVar1 + ~MPP_VIDEO_CodingHEVC < 3) || (MVar1 == MPP_VIDEO_CodingAVC)) {
LAB_00129f6d:
      if (RVar11 == 0) {
        RVar11 = cfg->height;
      }
      uVar10 = cfg->width + 0x3f & 0xffffffc0;
LAB_00129f82:
      uVar9 = RVar11 + 0xf & 0xfffffff0;
    }
    else {
      if (MVar1 != MPP_VIDEO_CodingVP9) {
        if ((MVar1 == MPP_VIDEO_CodingAV1) || (MVar1 == MPP_VIDEO_CodingHEVC)) goto LAB_00129f6d;
        if (RVar11 == 0) {
          RVar11 = cfg->height;
        }
        uVar10 = cfg->width + 0xf & 0xfffffff0;
        goto LAB_00129f82;
      }
      if (RVar11 == 0) {
        RVar11 = cfg->height;
      }
      uVar10 = cfg->width + 0x3f & 0xffffffc0;
      uVar9 = RVar11 + 0x3f & 0xffffffc0;
    }
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar10,(ulong)uVar9);
    }
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar7 = uVar10 + 0x3f & 0xffffffc0;
    }
    else {
      uVar7 = uVar10 + 0xff & 0xfffffe00 | 0x100;
    }
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","need 256 odd align: %d\n","mpp_sys_dec_buf_chk_proc");
    }
    uVar8 = 0x3fffffc0;
    iVar5 = 0x3f;
    if (((3 < MVar1 + ~MPP_VIDEO_CodingVP6) && (MVar1 != MPP_VIDEO_CodingAVC)) &&
       (MVar1 != MPP_VIDEO_CodingVP9)) {
      uVar8 = 0x3ffffff0;
      iVar5 = 0xf;
    }
    uVar8 = (uVar7 * iVar12 >> 3) + iVar5 & uVar8;
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar8);
    }
    cfg->h_stride_by_byte = uVar8;
    cfg->h_stride_by_pixel = uVar10;
    cfg->v_stride = uVar9;
    switch(MVar14) {
    case MPP_FMT_YUV420SP:
      bpp = 0xc;
      break;
    case MPP_FMT_YUV420SP_10BIT:
      bpp = 0xf;
      break;
    case MPP_FMT_YUV422SP:
      bpp = 0x10;
      break;
    case MPP_FMT_YUV422SP_10BIT:
      bpp = 0x14;
      break;
    default:
      if (MVar14 != MPP_FMT_YUV444SP) {
        uVar7 = uVar9 * uVar8 * 3 >> 1;
        _mpp_log_l(2,"mpp_sys_cfg","dec out fmt 0x%x is no support",(char *)0x0,(ulong)MVar14);
        goto LAB_0012a20d;
      }
      bpp = 0x18;
    }
    uVar7 = get_afbc_min_size(uVar10,uVar9,bpp);
LAB_0012a20d:
    if (((((byte)mpp_sys_cfg_debug & 0x10) != 0) &&
        (_mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",
                    (ulong)uVar10), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
       ((_mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar8)
        , ((byte)mpp_sys_cfg_debug & 0x10) != 0 &&
        (_mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",
                    (ulong)uVar9), ((byte)mpp_sys_cfg_debug & 0x10) != 0)))) {
      _mpp_log_l(4,"mpp_sys_cfg","res GPU aligned size_total: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar7);
    }
    cfg->size_total = uVar7;
    return MPP_OK;
  }
  RVar3 = mpp_get_soc_type();
  RVar11 = cfg->width;
  switch(MVar1) {
  case MPP_VIDEO_CodingAVC:
    RVar11 = RVar11 + 0xf & 0xfffffff0;
  case MPP_VIDEO_CodingMPEG2:
  case MPP_VIDEO_CodingH263:
  case MPP_VIDEO_CodingMPEG4:
  case MPP_VIDEO_CodingVP8:
    RVar13 = cfg->height;
LAB_0012a039:
    uVar10 = RVar13 + 0xf & 0xfffffff0;
    break;
  case MPP_VIDEO_CodingVP9:
    RVar13 = cfg->height;
    if (RVar3 == ROCKCHIP_SOC_RK3588) goto LAB_0012a039;
    if (RVar3 != ROCKCHIP_SOC_RK3399) goto LAB_0012a141;
    uVar10 = RVar13 + 0x3f & 0xffffffc0;
    break;
  default:
    if ((MVar1 != MPP_VIDEO_CodingAV1) &&
       ((MVar1 == MPP_VIDEO_CodingAVS2 || (MVar1 == MPP_VIDEO_CodingHEVC)))) {
      RVar11 = RVar11 + 0x3f & 0xffffffc0;
    }
  case MPP_VIDEO_CodingWMV:
  case MPP_VIDEO_CodingRV:
  case MPP_VIDEO_CodingMJPEG:
    RVar13 = cfg->height;
LAB_0012a141:
    uVar10 = RVar13 + 7 & 0xfffffff8;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)RVar11,(ulong)uVar10);
  }
  RVar13 = iVar12 * RVar11 >> 3;
  if (cfg->h_stride_by_byte != 0) {
    RVar13 = cfg->h_stride_by_byte;
  }
  if (MVar1 == MPP_VIDEO_CodingVP9) {
    if (RVar3 == ROCKCHIP_SOC_RK3576) {
      RVar13 = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,RVar13);
    }
    else {
      RVar13 = RVar13 + 0xff & 0xfffffe00 | 0x100;
    }
  }
  else if (MVar1 == MPP_VIDEO_CodingAV1) {
    if (RVar3 == ROCKCHIP_SOC_RK3588) goto LAB_0012a2c6;
    RVar13 = RVar13 + 0x7f & 0xffffff80;
  }
  else if (MVar1 == MPP_VIDEO_CodingHEVC) {
    RVar13 = RVar13 + 0x3f & 0xffffffc0;
  }
  else {
LAB_0012a2c6:
    RVar13 = RVar13 + 0xf & 0xfffffff0;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)RVar13);
  }
  if (MVar1 != MPP_VIDEO_CodingMJPEG &&
      ((RVar3 == ROCKCHIP_SOC_RK3399 || RVar3 == ROCKCHIP_SOC_RK3576) || 0x780 < RVar13)) {
    if (RVar3 - ROCKCHIP_SOC_RK3568 < 4) {
LAB_0012a3b4:
      RVar13 = RVar13 + 0xff & 0xfffffe00 | 0x100;
    }
    else {
      if (RVar3 != ROCKCHIP_SOC_RK3576) {
        if (RVar3 != ROCKCHIP_SOC_RK3399) goto LAB_0012a434;
        goto LAB_0012a3b4;
      }
      RVar13 = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,RVar13);
    }
    if (MVar14 < MPP_FMT_AYUV2BPP) {
      if ((0x2000aU >> (MVar2 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) == 0) {
        if ((0x300U >> (MVar2 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) == 0) goto LAB_0012a402;
        goto LAB_0012a42e;
      }
      uVar6 = 10;
      uVar9 = RVar13 * 8;
LAB_0012a425:
      RVar11 = (uint)(uVar9 / uVar6);
    }
    else {
LAB_0012a402:
      if (MVar14 - MPP_FMT_RGB565 < 2) {
LAB_0012a42e:
        RVar11 = RVar13 >> 1;
      }
      else {
        RVar11 = RVar13;
        if (MVar14 - MPP_FMT_RGB888 < 2) {
          uVar6 = 3;
          uVar9 = RVar13;
          goto LAB_0012a425;
        }
      }
    }
  }
LAB_0012a434:
  bVar15 = true;
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw performance aligned hor_byte: [%d]\n",
               "mpp_sys_dec_buf_chk_proc",(ulong)RVar11);
    bVar15 = ((byte)mpp_sys_cfg_debug & 0x10) == 0;
  }
  cfg->h_stride_by_byte = RVar13;
  cfg->h_stride_by_pixel = RVar11;
  cfg->v_stride = uVar10;
  if ((((!bVar15) &&
       (_mpp_log_l(4,"mpp_sys_cfg","fmt_raw %x\n","mpp_sys_dec_buf_chk_proc",(ulong)MVar2),
       ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
      (_mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",(ulong)RVar11)
      , ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
     (_mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",(ulong)RVar13),
     ((byte)mpp_sys_cfg_debug & 0x10) != 0)) {
    _mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar10);
  }
  uVar10 = RVar13 * uVar10;
  uVar9 = uVar10;
  switch(MVar2) {
  case MPP_FMT_YUV420SP:
  case MPP_FMT_YUV420SP_10BIT:
  case MPP_FMT_YUV420P:
  case MPP_FMT_YUV420SP_VU:
    SVar4 = MVar1 == MPP_VIDEO_CodingAVC | SYS_CFG_ALIGN_LEN_DEFAULT;
    bVar15 = MVar1 == MPP_VIDEO_CodingAV1;
    type = SYS_CFG_ALIGN_LEN_420_AV1;
    goto LAB_0012a585;
  case MPP_FMT_YUV422SP:
  case MPP_FMT_YUV422SP_10BIT:
  case MPP_FMT_YUV422P:
  case MPP_FMT_YUV422SP_VU:
  case MPP_FMT_YUV422_YUYV:
  case MPP_FMT_YUV422_YVYU:
  case MPP_FMT_YUV422_UYVY:
  case MPP_FMT_YUV422_VYUY:
  case MPP_FMT_YUV440SP:
  case MPP_FMT_YUV411SP:
    SVar4 = (uint)(MVar1 == MPP_VIDEO_CodingAV1) * 4 + SYS_CFG_ALIGN_LEN_422;
    bVar15 = MVar1 == MPP_VIDEO_CodingAVC;
    type = SYS_CFG_ALIGN_LEN_422_AVC;
LAB_0012a585:
    if (!bVar15) {
      type = SVar4;
    }
    uVar9 = mpp_sys_cfg_align(type,uVar10);
    break;
  case MPP_FMT_YUV400:
    break;
  case MPP_FMT_YUV444SP:
  case MPP_FMT_YUV444P:
  case MPP_FMT_YUV444SP_10BIT:
    uVar9 = (uVar10 + 0xf & 0xfffffff0) * 3;
    break;
  default:
    uVar9 = uVar10 * 3 >> 1;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res size total %d -> %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar10,
               (ulong)uVar9);
  }
  cfg->size_total = uVar9;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)
{
    MppCodingType type = cfg->type;
    MppFrameFormat fmt = (MppFrameFormat)(((RK_U32)cfg->fmt_codec & MPP_FRAME_FMT_MASK) |
                                          (cfg->fmt_fbc & MPP_FRAME_FBC_MASK) |
                                          (cfg->fmt_hdr & MPP_FRAME_HDR_MASK));
    MppFrameFormat fmt_raw = cfg->fmt_codec;

    RK_U32 aligned_pixel = 0;
    RK_U32 aligned_pixel_byte = 0;
    RK_U32 aligned_byte = 0;
    RK_U32 aligned_height = 0;
    RK_U32 size_total = 0;
    RK_U32 size_total_old = 0;
    RK_U32 depth = MPP_FRAME_FMT_IS_YUV_10BIT(fmt) ? 10 : 8;

    if (type == MPP_VIDEO_CodingUnused) {
        mpp_err("The coding type is invalid");
        return MPP_NOK;
    }

    /* use codec stride */
    if (cfg->h_stride_by_byte)
        aligned_pixel = cfg->h_stride_by_byte * 8 / depth;
    if (cfg->v_stride)
        aligned_height = cfg->v_stride;

    sys_cfg_dbg_dec_buf("org pixel wxh: [%d %d]\n", cfg->width, cfg->height);
    sys_cfg_dbg_dec_buf("outside stride wxh: [%d %d]\n",
                        cfg->h_stride_by_byte, cfg->v_stride);
    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        /* fbc case */
        switch (type) {
        case MPP_VIDEO_CodingHEVC :
        case MPP_VIDEO_CodingAV1 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 64);
        } break;
        default : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        /*fbc stride default 64 align*/
        if (*compat_ext_fbc_hdr_256_odd)
            aligned_pixel_byte = (MPP_ALIGN(aligned_pixel, 256) | 256) * depth >> 3;
        else
            aligned_pixel_byte = MPP_ALIGN(aligned_pixel, 64) * depth >> 3;
        sys_cfg_dbg_dec_buf("need 256 odd align: %d\n", *compat_ext_fbc_hdr_256_odd);

        switch (type) {
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        default : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d]\n", aligned_byte);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        switch ((fmt_raw & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV420SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 15);
        } break;
        case MPP_FMT_YUV422SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 20);
        } break;
        case MPP_FMT_YUV420SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 12);
        } break;
        case MPP_FMT_YUV422SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 16);
        } break;
        case MPP_FMT_YUV444SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 24);
        } break;
        default : {
            size_total = aligned_byte * aligned_height * 3 / 2;
            mpp_err("dec out fmt 0x%x is no support", fmt_raw & MPP_FRAME_FMT_MASK);
        } break;
        }
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);
        sys_cfg_dbg_dec_buf("res GPU aligned size_total: [%d]\n", size_total);

        cfg->size_total = size_total;
    } else {
        /* tile case */
        /* raster case */
        RockchipSocType soc_type = mpp_get_soc_type();

        aligned_pixel = cfg->width;
        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        /*
         * avc aligned to ctu
         * p_Vid->width = p_Vid->PicWidthInMbs * 16
         * p_Vid->height = p_Vid->FrameHeightInMbs * 16
         */
        case MPP_VIDEO_CodingAVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3399)
                aligned_height = MPP_ALIGN(cfg->height, 64);
            else if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_height = MPP_ALIGN(cfg->height, 16);
            else
                aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingVP8 :
        case MPP_VIDEO_CodingH263 :
        case MPP_VIDEO_CodingMPEG2 :
        case MPP_VIDEO_CodingMPEG4 : {
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        default : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        aligned_pixel_byte = cfg->h_stride_by_byte ? cfg->h_stride_by_byte :
                             aligned_pixel * depth / 8;

        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_64, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3576)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,
                                                 aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128, aligned_pixel_byte);
        } break;
        default : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d %d]\n", aligned_byte);

        /*
         * NOTE: rk3576 use 128 odd plus 64 for all non jpeg format
         * all the other socs use 256 odd on larger than 1080p
         */
        if ((aligned_byte > 1920 || soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RK3399)
            && type != MPP_VIDEO_CodingMJPEG) {
            rk_s32 update = 0;

            switch (soc_type) {
            case ROCKCHIP_SOC_RK3399 :
            case ROCKCHIP_SOC_RK3568 :
            case ROCKCHIP_SOC_RK3562 :
            case ROCKCHIP_SOC_RK3528 :
            case ROCKCHIP_SOC_RK3588 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_byte);
                update = 1;
            } break;
            case ROCKCHIP_SOC_RK3576 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64, aligned_byte);
                update = 1;
            } break;
            default : {
            } break;
            }

            /*
             * recalc aligned_pixel here
             * NOTE: no RGB format here in fact
             */
            if (update) {
                switch (fmt & MPP_FRAME_FMT_MASK) {
                case MPP_FMT_YUV420SP_10BIT:
                case MPP_FMT_YUV422SP_10BIT:
                case MPP_FMT_YUV444SP_10BIT: {
                    aligned_pixel = aligned_byte * 8 / 10;
                } break;
                case MPP_FMT_YUV422_YVYU:
                case MPP_FMT_YUV422_YUYV:
                case MPP_FMT_RGB565:
                case MPP_FMT_BGR565: {
                    aligned_pixel = aligned_byte / 2;
                } break;
                case MPP_FMT_RGB888:
                case MPP_FMT_BGR888: {
                    aligned_pixel = aligned_byte / 3;
                } break;
                default : {
                    aligned_pixel = aligned_byte;
                } break;
                }
            }
        }
        sys_cfg_dbg_dec_buf("dec hw performance aligned hor_byte: [%d]\n", aligned_pixel);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        size_total = aligned_byte * aligned_height;
        size_total_old = size_total;
        sys_cfg_dbg_dec_buf("fmt_raw %x\n", fmt_raw);
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);

        switch (fmt_raw) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420P :
        case MPP_FMT_YUV420SP_VU : {
            SysCfgAlignType align_type = SYS_CFG_ALIGN_LEN_DEFAULT;

            /* hevc and vp9 - SYS_CFG_ALIGN_LEN_DEFAULT */
            if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_420_AV1;
            else if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_420;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422P :
        case MPP_FMT_YUV422SP_VU :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY :
        case MPP_FMT_YUV440SP :
        case MPP_FMT_YUV411SP : {
            SysCfgAlignType align_type;

            if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_422_AVC;
            else if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_422_AV1;
            else
                align_type = SYS_CFG_ALIGN_LEN_422;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV400 : {
            /* do nothing */
        } break;
        case MPP_FMT_YUV444SP :
        case MPP_FMT_YUV444P :
        case MPP_FMT_YUV444SP_10BIT : {
            size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_LEN_444, size_total);
        } break;
        default : {
            size_total = size_total * 3 / 2;
        }
        }
        sys_cfg_dbg_dec_buf("res size total %d -> %d\n", size_total_old, size_total);

        cfg->size_total = size_total;
    }

    return MPP_OK;
}